

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_m2vd_vdpu2.c
# Opt level: O0

MPP_RET hal_m2vd_vdpu2_wait(void *hal,HalTaskInfo *task)

{
  RK_U32 *p_reg;
  long lStack_30;
  int k;
  M2vdVdpu2Reg *reg_out;
  M2vdHalCtx *ctx;
  HalTaskInfo *pHStack_18;
  MPP_RET ret;
  HalTaskInfo *task_local;
  void *hal_local;
  
  ctx._4_4_ = 0;
  lStack_30 = *(long *)((long)hal + 0x68);
  reg_out = (M2vdVdpu2Reg *)hal;
  pHStack_18 = task;
  task_local = (HalTaskInfo *)hal;
  if ((m2vh_debug & 1) != 0) {
    _mpp_log_l(4,"hal_m2vd_vdpu2","%s: line(%d), func(%s)",(char *)0x0,"enter\n",0x17d,
               "hal_m2vd_vdpu2_wait");
  }
  ctx._4_4_ = mpp_dev_ioctl(*(MppDev *)(reg_out->ppReg + 0x24),0x10,(void *)0x0);
  if (ctx._4_4_ != MPP_OK) {
    _mpp_log_l(2,"hal_m2vd_vdpu2","poll cmd failed %d\n","hal_m2vd_vdpu2_wait",
               (ulong)(uint)ctx._4_4_);
  }
  if (*(long *)(reg_out->ppReg + 0x28) != 0) {
    fprintf(*(FILE **)(reg_out->ppReg + 0x28),"Frame #%d\n",(ulong)reg_out->ppReg[0x20]);
    for (p_reg._4_4_ = 0; (int)p_reg._4_4_ < 0x9f; p_reg._4_4_ = p_reg._4_4_ + 1) {
      fprintf(*(FILE **)(reg_out->ppReg + 0x28),"[(D)%03d, (X)%03x]  %08x\n",(ulong)p_reg._4_4_,
              (ulong)p_reg._4_4_,
              (ulong)*(uint *)((long)&stack0xffffffffffffffd0 + (long)(int)p_reg._4_4_ * 4));
    }
    fflush(*(FILE **)(reg_out->ppReg + 0x28));
  }
  if (((*(uint *)(lStack_30 + 0xdc) >> 0xc & 1) != 0 || (*(uint *)(lStack_30 + 0xdc) >> 6 & 1) != 0)
     && (*(long *)(reg_out->ppReg + 0x22) != 0)) {
    mpp_callback_f("hal_m2vd_vdpu2_wait",*(MppCbCtx **)(reg_out->ppReg + 0x22),(void *)0x0);
  }
  if ((m2vh_debug & 8) != 0) {
    _mpp_log_l(4,"hal_m2vd_vdpu2","mpp_device_wait_reg return interrupt:%08x",(char *)0x0,
               (ulong)*(uint *)(lStack_30 + 0xdc));
  }
  if ((m2vh_debug & 1) != 0) {
    _mpp_log_l(4,"hal_m2vd_vdpu2","%s: line(%d), func(%s)",(char *)0x0,"leave\n",0x194,
               "hal_m2vd_vdpu2_wait");
  }
  return ctx._4_4_;
}

Assistant:

MPP_RET hal_m2vd_vdpu2_wait(void *hal, HalTaskInfo *task)
{
    MPP_RET ret = MPP_OK;
    M2vdHalCtx *ctx = (M2vdHalCtx *)hal;
    M2vdVdpu2Reg* reg_out = (M2vdVdpu2Reg * )ctx->regs;

    m2vh_dbg_func("enter\n");

    ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_CMD_POLL, NULL);
    if (ret)
        mpp_err_f("poll cmd failed %d\n", ret);

    if (ctx->fp_reg_out) {
        int k = 0;
        RK_U32 *p_reg = (RK_U32*)&reg_out;
        fprintf(ctx->fp_reg_out, "Frame #%d\n", ctx->dec_frame_cnt);
        for (k = 0; k < M2VD_VDPU2_REG_NUM; k++)
            fprintf(ctx->fp_reg_out, "[(D)%03d, (X)%03x]  %08x\n", k, k, p_reg[k]);
        fflush(ctx->fp_reg_out);
    }
    if (reg_out->sw55.dec_error_int | reg_out->sw55.dec_buffer_int) {
        if (ctx->dec_cb)
            mpp_callback(ctx->dec_cb, NULL);
    }

    if (M2VH_DBG_IRQ & m2vh_debug)
        mpp_log("mpp_device_wait_reg return interrupt:%08x", reg_out->sw55);

    (void)task;
    m2vh_dbg_func("leave\n");
    return ret;
}